

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDCLoader.cpp
# Opt level: O3

void __thiscall Assimp::MDCImporter::ValidateHeader(MDCImporter *this)

{
  uint32_t uVar1;
  Logger *this_00;
  Header *pHVar2;
  runtime_error *prVar3;
  size_t sVar4;
  char szBuffer [5];
  char local_65 [4];
  undefined1 local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pHVar2 = this->pcHeader;
  uVar1 = pHVar2->ulIdent;
  if ((uVar1 != 0x43504449) && (uVar1 != 0x49445043)) {
    local_65[0] = (char)uVar1;
    local_65[1] = (char)(uVar1 >> 8);
    local_65[2] = (char)(uVar1 >> 0x10);
    local_65[3] = (char)(uVar1 >> 0x18);
    local_61 = 0;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    sVar4 = strlen(local_65);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,local_65,local_65 + sVar4);
    std::operator+(&local_60,"Invalid MDC magic word: should be IDPC, the magic word found is ",
                   &local_40);
    std::runtime_error::runtime_error(prVar3,(string *)&local_60);
    *(undefined ***)prVar3 = &PTR__runtime_error_008dc448;
    __cxa_throw(prVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (pHVar2->ulVersion != 2) {
    this_00 = DefaultLogger::get();
    Logger::warn(this_00,"Unsupported MDC file version (2 (AI_MDC_VERSION) was expected)");
    pHVar2 = this->pcHeader;
  }
  if (((ulong)pHVar2->ulNumFrames * 0x38 + (ulong)pHVar2->ulOffsetBorderFrames <=
       (ulong)this->fileSize) &&
     ((ulong)pHVar2->ulNumSurfaces * 0x7c + (ulong)pHVar2->ulOffsetSurfaces <= (ulong)this->fileSize
     )) {
    if (this->configFrameID < pHVar2->ulNumFrames) {
      return;
    }
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"The requested frame is not available","");
    std::runtime_error::runtime_error(prVar3,(string *)&local_60);
    *(undefined ***)prVar3 = &PTR__runtime_error_008dc448;
    __cxa_throw(prVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,
             "Some of the offset values in the MDC header are invalid and point to something behind the file."
             ,"");
  std::runtime_error::runtime_error(prVar3,(string *)&local_60);
  *(undefined ***)prVar3 = &PTR__runtime_error_008dc448;
  __cxa_throw(prVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MDCImporter::ValidateHeader()
{
    AI_SWAP4( this->pcHeader->ulVersion );
    AI_SWAP4( this->pcHeader->ulFlags );
    AI_SWAP4( this->pcHeader->ulNumFrames );
    AI_SWAP4( this->pcHeader->ulNumTags );
    AI_SWAP4( this->pcHeader->ulNumSurfaces );
    AI_SWAP4( this->pcHeader->ulNumSkins );
    AI_SWAP4( this->pcHeader->ulOffsetBorderFrames );

    if (pcHeader->ulIdent != AI_MDC_MAGIC_NUMBER_BE &&
        pcHeader->ulIdent != AI_MDC_MAGIC_NUMBER_LE)
    {
        char szBuffer[5];
        szBuffer[0] = ((char*)&pcHeader->ulIdent)[0];
        szBuffer[1] = ((char*)&pcHeader->ulIdent)[1];
        szBuffer[2] = ((char*)&pcHeader->ulIdent)[2];
        szBuffer[3] = ((char*)&pcHeader->ulIdent)[3];
        szBuffer[4] = '\0';

        throw DeadlyImportError("Invalid MDC magic word: should be IDPC, the "
            "magic word found is " + std::string( szBuffer ));
    }

    if (pcHeader->ulVersion != AI_MDC_VERSION) {
        ASSIMP_LOG_WARN("Unsupported MDC file version (2 (AI_MDC_VERSION) was expected)");
    }

    if (pcHeader->ulOffsetBorderFrames + pcHeader->ulNumFrames * sizeof(MDC::Frame) > this->fileSize ||
        pcHeader->ulOffsetSurfaces + pcHeader->ulNumSurfaces * sizeof(MDC::Surface) > this->fileSize)
    {
        throw DeadlyImportError("Some of the offset values in the MDC header are invalid "
            "and point to something behind the file.");
    }

    if (this->configFrameID >= this->pcHeader->ulNumFrames) {
        throw DeadlyImportError("The requested frame is not available");
    }
}